

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,function_expression *e)

{
  undefined1 local_30 [24];
  function_expression *e_local;
  impl *this_local;
  
  local_30._16_8_ = e;
  e_local = (function_expression *)this;
  this_local = (impl *)__return_storage_ptr__;
  create_function((impl *)local_30,(function_base *)this,(scope_ptr *)&e->super_function_base);
  value::value(__return_storage_ptr__,(object_ptr *)local_30);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const function_expression& e) {
        // string{heap_, s.id()}
        return value{create_function(e, active_scope_)};
    }